

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

void __thiscall NotNode::NotNode(NotNode *this)

{
  NotNode *this_local;
  
  cmGeneratorExpressionNode::cmGeneratorExpressionNode(&this->super_cmGeneratorExpressionNode);
  (this->super_cmGeneratorExpressionNode)._vptr_cmGeneratorExpressionNode =
       (_func_int **)&PTR__NotNode_00aea160;
  return;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    if (parameters.front() != "0" && parameters.front() != "1") {
      reportError(
        context, content->GetOriginalExpression(),
        "$<NOT> parameter must resolve to exactly one '0' or '1' value.");
      return std::string();
    }
    return parameters.front() == "0" ? "1" : "0";
  }